

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalNinjaGenerator::MakeCustomLauncher_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmCustomCommandGenerator *ccg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  int iVar2;
  char *__s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  string *psVar4;
  undefined4 extraout_var;
  size_t sVar5;
  pointer *__ptr;
  string output;
  RuleVariables vars;
  string local_198;
  string local_178;
  undefined1 local_158 [104];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_158._0_8_ = local_158 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"RULE_LAUNCH_CUSTOM","");
  __s = cmMakefile::GetProperty(this_00,(string *)local_158);
  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
  if ((__s == (char *)0x0) || (*__s == '\0')) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)local_158);
    local_178._M_string_length = 0;
    local_178.field_2._M_local_buf[0] = '\0';
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    pvVar3 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
    if ((pvVar3->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (pvVar3->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::_M_assign((string *)&local_178);
      cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&local_198,ccg);
      paVar1 = &local_198.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar1) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      if (local_198._M_string_length == 0) {
        psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
        cmLocalGenerator::MaybeConvertToRelativePath
                  (&local_198,(cmLocalGenerator *)this,psVar4,&local_178);
        std::__cxx11::string::operator=((string *)&local_178,(string *)&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != paVar1) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
      }
      cmOutputConverter::ConvertToOutputFormat
                (&local_198,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,&local_178,SHELL);
      std::__cxx11::string::operator=((string *)&local_178,(string *)&local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar1) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
    }
    local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_178._M_dataplus._M_p;
    iVar2 = (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])
                      (this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_198._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar2);
    sVar5 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar5);
    cmRulePlaceholderExpander::ExpandRuleVariables
              ((cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar2),
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               __return_storage_ptr__,(RuleVariables *)local_158);
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((cmRulePlaceholderExpander *)local_198._M_dataplus._M_p != (cmRulePlaceholderExpander *)0x0)
    {
      std::default_delete<cmRulePlaceholderExpander>::operator()
                ((default_delete<cmRulePlaceholderExpander> *)&local_198,
                 (cmRulePlaceholderExpander *)local_198._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,
                      CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                               local_178.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::MakeCustomLauncher(
  cmCustomCommandGenerator const& ccg)
{
  const char* property_value =
    this->Makefile->GetProperty("RULE_LAUNCH_CUSTOM");

  if (!property_value || !*property_value) {
    return std::string();
  }

  // Expand rule variables referenced in the given launcher command.
  cmRulePlaceholderExpander::RuleVariables vars;

  std::string output;
  const std::vector<std::string>& outputs = ccg.GetOutputs();
  if (!outputs.empty()) {
    output = outputs[0];
    if (ccg.GetWorkingDirectory().empty()) {
      output = this->MaybeConvertToRelativePath(
        this->GetCurrentBinaryDirectory(), output);
    }
    output = this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
  }
  vars.Output = output.c_str();

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->CreateRulePlaceholderExpander());

  std::string launcher = property_value;
  rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
  if (!launcher.empty()) {
    launcher += " ";
  }

  return launcher;
}